

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::FieldDescriptorProto::ByteSize(FieldDescriptorProto *this)

{
  byte bVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FieldOptions *value;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar4 = (uint)bVar1;
  iVar5 = 0;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      iVar5 = internal::WireFormatLite::StringSize(this->name_);
      iVar5 = iVar5 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 & 2) != 0) {
      iVar6 = io::CodedOutputStream::VarintSize32SignExtended(this->number_);
      iVar5 = iVar5 + iVar6 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 & 4) != 0) {
      iVar6 = io::CodedOutputStream::VarintSize32SignExtended(this->label_);
      iVar5 = iVar5 + iVar6 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 & 8) != 0) {
      iVar6 = io::CodedOutputStream::VarintSize32SignExtended(this->type_);
      iVar5 = iVar5 + iVar6 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 & 0x10) != 0) {
      iVar6 = internal::WireFormatLite::StringSize(this->type_name_);
      iVar5 = iVar5 + iVar6 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 & 0x20) != 0) {
      iVar6 = internal::WireFormatLite::StringSize(this->extendee_);
      iVar5 = iVar5 + iVar6 + 1;
      uVar4 = this->_has_bits_[0];
    }
    cVar3 = (char)uVar4;
    if ((uVar4 & 0x40) != 0) {
      iVar6 = internal::WireFormatLite::StringSize(this->default_value_);
      iVar5 = iVar5 + iVar6 + 1;
      cVar3 = (char)this->_has_bits_[0];
    }
    if (cVar3 < '\0') {
      value = this->options_;
      if (value == (FieldOptions *)0x0) {
        value = *(FieldOptions **)(default_instance_ + 0x38);
      }
      iVar6 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldOptions>(value);
      iVar5 = iVar5 + iVar6 + 1;
    }
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar5 = iVar6 + iVar5;
  }
  this->_cached_size_ = iVar5;
  return iVar5;
}

Assistant:

int FieldDescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional int32 number = 3;
    if (has_number()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->number());
    }

    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (has_label()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (has_type()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
    }

    // optional string type_name = 6;
    if (has_type_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->type_name());
    }

    // optional string extendee = 2;
    if (has_extendee()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->extendee());
    }

    // optional string default_value = 7;
    if (has_default_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->default_value());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}